

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::reallocateTo
          (SmallVectorBase<slang::SourceBuffer> *this,size_type newCapacity)

{
  SourceBuffer *__result;
  iterator __first;
  iterator __last;
  pointer newData;
  size_type newCapacity_local;
  SmallVectorBase<slang::SourceBuffer> *this_local;
  
  __result = (SourceBuffer *)slang::detail::allocArray(newCapacity,0x18);
  __first = begin(this);
  __last = end(this);
  std::uninitialized_move<slang::SourceBuffer*,slang::SourceBuffer*>(__first,__last,__result);
  cleanup(this,(EVP_PKEY_CTX *)__last);
  this->cap = newCapacity;
  this->data_ = __result;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)detail::allocArray(newCapacity, sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }